

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtptcptransmitter.cpp
# Opt level: O0

int __thiscall jrtplib::RTPTCPTransmitter::SetMaximumPacketSize(RTPTCPTransmitter *this,size_t s)

{
  size_t s_local;
  RTPTCPTransmitter *this_local;
  
  if ((this->m_init & 1U) == 0) {
    this_local._4_4_ = -0xb5;
  }
  else if ((this->m_created & 1U) == 0) {
    this_local._4_4_ = -0xbb;
  }
  else if (s < 0x10000) {
    this->m_maxPackSize = s;
    this_local._4_4_ = 0;
  }
  else {
    this_local._4_4_ = -0xc0;
  }
  return this_local._4_4_;
}

Assistant:

int RTPTCPTransmitter::SetMaximumPacketSize(size_t s)	
{
	if (!m_init)
		return ERR_RTP_TCPTRANS_NOTINIT;
	
	MAINMUTEX_LOCK
	if (!m_created)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_TCPTRANS_NOTCREATED;
	}
	if (s > RTPTCPTRANS_MAXPACKSIZE)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_TCPTRANS_SPECIFIEDSIZETOOBIG;
	}
	m_maxPackSize = s;
	MAINMUTEX_UNLOCK
	return 0;
}